

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O3

int secp256k1_jacobi64_maybe_var(secp256k1_modinv64_signed62 *x,secp256k1_modinv64_modinfo *modinfo)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  secp256k1_modinv64_modinfo *unaff_RBX;
  secp256k1_modinv64_modinfo *psVar7;
  secp256k1_fe *psVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  code *pcVar12;
  secp256k1_fe *psVar13;
  uint64_t *puVar14;
  uint64_t *puVar15;
  secp256k1_fe *psVar16;
  code *pcVar17;
  int iVar18;
  secp256k1_fe *psVar19;
  uint uVar20;
  code *unaff_R14;
  code *pcVar21;
  uint uVar22;
  long lVar23;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_trans2x2 t;
  secp256k1_fe sStack_108;
  secp256k1_modinv64_modinfo *psStack_d8;
  code *pcStack_d0;
  secp256k1_fe local_c8;
  secp256k1_fe local_98;
  secp256k1_modinv64_modinfo *local_68;
  ulong local_60;
  code *local_58;
  secp256k1_modinv64_trans2x2 local_50;
  
  local_98.n[4] = (modinfo->modulus).v[4];
  uVar11 = (modinfo->modulus).v[0];
  local_98.n[1] = (modinfo->modulus).v[1];
  local_98.n[2] = (modinfo->modulus).v[2];
  local_98.n[3] = (modinfo->modulus).v[3];
  local_c8.n[0] = x->v[0];
  local_c8.n[1] = x->v[1];
  local_c8.n[2] = x->v[2];
  local_c8.n[3] = x->v[3];
  local_c8.n[4] = x->v[4];
  local_98.n[0] = uVar11;
  if (((((long)local_c8.n[0] < 0) || ((long)local_c8.n[1] < 0)) ||
      (unaff_RBX = modinfo, (long)local_c8.n[2] < 0)) ||
     ((x = (secp256k1_modinv64_signed62 *)local_c8.n[3], (long)local_c8.n[3] < 0 ||
      ((long)local_c8.n[4] < 0)))) {
LAB_00151c1d:
    pcStack_d0 = (code *)0x151c22;
    secp256k1_jacobi64_maybe_var_cold_18();
  }
  else if (((local_c8.n[2] != 0 || (secp256k1_fe *)local_c8.n[3] != (secp256k1_fe *)0x0) ||
           (local_c8.n[1] != 0 || local_c8.n[0] != 0)) || local_c8.n[4] != 0) {
    unaff_R14 = (code *)0x5;
    lVar9 = -1;
    local_60 = 0;
    psVar7 = (secp256k1_modinv64_modinfo *)0x0;
    local_68 = modinfo;
    do {
      unaff_RBX = local_68;
      psVar13 = (secp256k1_fe *)(local_98.n[1] << 0x3e | uVar11);
      puVar14 = (uint64_t *)(local_c8.n[1] << 0x3e | local_c8.n[0]);
      lVar1 = 0;
      pcVar17 = (code *)0x0;
      lVar23 = 1;
      iVar5 = 0x3e;
      pcVar21 = (code *)0x1;
      puVar15 = puVar14;
      psVar19 = psVar13;
      while( true ) {
        uVar11 = -1L << ((byte)iVar5 & 0x3f) | (ulong)puVar15;
        lVar2 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        bVar3 = (byte)lVar2;
        psVar16 = (secp256k1_fe *)((ulong)puVar15 >> (bVar3 & 0x3f));
        pcVar21 = (code *)((long)pcVar21 << (bVar3 & 0x3f));
        lVar1 = lVar1 << (bVar3 & 0x3f);
        lVar9 = lVar9 - lVar2;
        uVar20 = ((uint)((ulong)psVar19 >> 1) ^ (uint)((ulong)psVar19 >> 2)) & (uint)lVar2 ^
                 (uint)psVar7;
        iVar5 = iVar5 - (uint)lVar2;
        local_58 = unaff_R14;
        if (iVar5 == 0) break;
        if (((ulong)psVar19 & 1) == 0) {
          pcStack_d0 = (code *)0x151bd2;
          secp256k1_jacobi64_maybe_var_cold_7();
LAB_00151bd2:
          pcStack_d0 = (code *)0x151bd7;
          secp256k1_jacobi64_maybe_var_cold_6();
LAB_00151bd7:
          pcStack_d0 = (code *)0x151bdc;
          secp256k1_jacobi64_maybe_var_cold_1();
LAB_00151bdc:
          pcStack_d0 = (code *)0x151be1;
          secp256k1_jacobi64_maybe_var_cold_2();
          goto LAB_00151be1;
        }
        if (((ulong)psVar16 & 1) == 0) goto LAB_00151bd2;
        bVar3 = 0x3e - (char)iVar5;
        psVar7 = (secp256k1_modinv64_modinfo *)((long)psVar19 << (bVar3 & 0x3f));
        if ((secp256k1_modinv64_modinfo *)(lVar1 * (long)puVar14 + (long)pcVar21 * (long)psVar13) !=
            psVar7) goto LAB_00151bd7;
        psVar7 = (secp256k1_modinv64_modinfo *)
                 (lVar23 * (long)puVar14 + (long)pcVar17 * (long)psVar13);
        if (psVar7 != (secp256k1_modinv64_modinfo *)((long)psVar16 << (bVar3 & 0x3f)))
        goto LAB_00151bdc;
        iVar18 = (int)psVar19;
        iVar10 = (int)psVar16;
        if (lVar9 < 0) {
          lVar9 = -lVar9;
          iVar4 = (int)lVar9 + 1;
          if (iVar5 <= iVar4) {
            iVar4 = iVar5;
          }
          if (0xffffffc1 < iVar4 - 0x3fU) {
            psVar7 = (secp256k1_modinv64_modinfo *)
                     (ulong)(uVar20 ^ (uint)(((ulong)psVar16 & (ulong)psVar19) >> 1));
            uVar11 = (ulong)(0x3fL << (-(char)iVar4 & 0x3fU)) >> (-(char)iVar4 & 0x3fU);
            uVar22 = (iVar10 * iVar10 + 0x3e) * iVar10 * iVar18 & (uint)uVar11;
            lVar2 = lVar1;
            lVar1 = lVar23;
            psVar8 = psVar16;
            pcVar12 = pcVar21;
            pcVar21 = pcVar17;
            goto LAB_001519ca;
          }
          goto LAB_00151beb;
        }
        iVar4 = (int)lVar9 + 1;
        if (iVar5 <= iVar4) {
          iVar4 = iVar5;
        }
        if (iVar4 - 0x3fU < 0xffffffc2) goto LAB_00151be6;
        uVar11 = (ulong)(0xfL << (-(char)iVar4 & 0x3fU)) >> (-(char)iVar4 & 0x3fU);
        uVar22 = -(iVar10 * ((iVar18 * 2 + 2U & 8) + iVar18)) & (uint)uVar11;
        lVar2 = lVar23;
        psVar8 = psVar19;
        pcVar12 = pcVar17;
        psVar19 = psVar16;
        psVar7 = (secp256k1_modinv64_modinfo *)(ulong)uVar20;
LAB_001519ca:
        uVar6 = (ulong)uVar22;
        puVar15 = (uint64_t *)((long)psVar19->n + uVar6 * (long)psVar8);
        pcVar17 = pcVar12 + (long)pcVar21 * uVar6;
        lVar23 = uVar6 * lVar1 + lVar2;
        psVar19 = psVar8;
        if (((ulong)puVar15 & uVar11) != 0) {
LAB_00151be1:
          pcStack_d0 = (code *)0x151be6;
          secp256k1_jacobi64_maybe_var_cold_4();
LAB_00151be6:
          pcStack_d0 = (code *)0x151beb;
          secp256k1_jacobi64_maybe_var_cold_3();
LAB_00151beb:
          pcStack_d0 = (code *)0x151bf0;
          secp256k1_jacobi64_maybe_var_cold_5();
          goto LAB_00151bf0;
        }
      }
      psVar13 = (secp256k1_fe *)(lVar1 * (long)pcVar17);
      lVar2 = (long)pcVar21 * lVar23 - (long)psVar13;
      uVar11 = (ulong)((secp256k1_fe *)((long)pcVar21 * lVar23) < psVar13);
      uVar6 = SUB168(SEXT816((long)pcVar21) * SEXT816(lVar23),8) -
              SUB168(SEXT816(lVar1) * SEXT816((long)pcVar17),8);
      local_50.u = (int64_t)pcVar21;
      local_50.v = lVar1;
      local_50.q = (int64_t)pcVar17;
      local_50.r = lVar23;
      if ((lVar2 != 0x4000000000000000 || uVar6 != uVar11) &&
         (uVar6 - uVar11 != -1 || lVar2 != -0x4000000000000000)) {
LAB_00151bf0:
        pcStack_d0 = (code *)0x151bf5;
        secp256k1_jacobi64_maybe_var_cold_16();
        unaff_RBX = psVar7;
        unaff_R14 = pcVar21;
LAB_00151bf5:
        pcStack_d0 = (code *)0x151bfa;
        secp256k1_jacobi64_maybe_var_cold_15();
LAB_00151bfa:
        pcStack_d0 = (code *)0x151bff;
        secp256k1_jacobi64_maybe_var_cold_14();
LAB_00151bff:
        pcStack_d0 = (code *)0x151c04;
        secp256k1_jacobi64_maybe_var_cold_13();
LAB_00151c04:
        pcStack_d0 = (code *)0x151c09;
        secp256k1_jacobi64_maybe_var_cold_12();
LAB_00151c09:
        x = (secp256k1_modinv64_signed62 *)psVar13;
        pcStack_d0 = (code *)0x151c0e;
        secp256k1_jacobi64_maybe_var_cold_11();
LAB_00151c0e:
        pcStack_d0 = (code *)0x151c13;
        secp256k1_jacobi64_maybe_var_cold_10();
LAB_00151c13:
        pcStack_d0 = (code *)0x151c18;
        secp256k1_jacobi64_maybe_var_cold_9();
LAB_00151c18:
        pcStack_d0 = (code *)0x151c1d;
        secp256k1_jacobi64_maybe_var_cold_8();
        goto LAB_00151c1d;
      }
      iVar10 = (int)unaff_R14;
      pcStack_d0 = (code *)0x151a73;
      psVar13 = &local_98;
      iVar5 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)&local_98,iVar10,&local_68->modulus,0);
      if (iVar5 < 1) goto LAB_00151bf5;
      pcStack_d0 = (code *)0x151a8e;
      psVar13 = &local_98;
      iVar5 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)&local_98,iVar10,&unaff_RBX->modulus,1);
      if (0 < iVar5) goto LAB_00151bfa;
      pcStack_d0 = (code *)0x151aa6;
      psVar13 = &local_c8;
      iVar5 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)&local_c8,iVar10,&unaff_RBX->modulus,0);
      if (iVar5 < 1) goto LAB_00151bff;
      pcStack_d0 = (code *)0x151ac1;
      psVar13 = &local_c8;
      iVar5 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)&local_c8,iVar10,&unaff_RBX->modulus,1);
      if (-1 < iVar5) goto LAB_00151c04;
      pcStack_d0 = (code *)0x151adc;
      secp256k1_modinv64_update_fg_62_var
                (iVar10,(secp256k1_modinv64_signed62 *)&local_98,
                 (secp256k1_modinv64_signed62 *)&local_c8,&local_50);
      uVar11 = local_98.n[0];
      if (local_98.n[0] == 1) {
        if (iVar10 < 2) {
LAB_00151bac:
          return 1 - (uVar20 * 2 & 2);
        }
        pcVar21 = (code *)0x1;
        uVar6 = 0;
        do {
          uVar6 = uVar6 | local_98.n[(long)pcVar21];
          pcVar21 = pcVar21 + 1;
        } while (unaff_R14 != pcVar21);
        if (uVar6 == 0) goto LAB_00151bac;
      }
      lVar1 = (long)iVar10;
      if ((-1 < lVar1 + -2 && local_c8.n[lVar1 + 5] == 0) && (&pcStack_d0)[lVar1] == (code *)0x0) {
        unaff_R14 = (code *)(ulong)(iVar10 - 1);
      }
      x = (secp256k1_modinv64_signed62 *)&local_98;
      pcStack_d0 = (code *)0x151b43;
      iVar10 = (int)unaff_R14;
      psVar13 = (secp256k1_fe *)x;
      iVar5 = secp256k1_modinv64_mul_cmp_62(x,iVar10,&unaff_RBX->modulus,0);
      if (iVar5 < 1) goto LAB_00151c09;
      pcStack_d0 = (code *)0x151b5e;
      iVar5 = secp256k1_modinv64_mul_cmp_62(x,iVar10,&unaff_RBX->modulus,1);
      if (0 < iVar5) goto LAB_00151c0e;
      pcStack_d0 = (code *)0x151b79;
      x = (secp256k1_modinv64_signed62 *)&local_c8;
      iVar5 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)&local_c8,iVar10,&unaff_RBX->modulus,0);
      if (iVar5 < 1) goto LAB_00151c13;
      pcStack_d0 = (code *)0x151b94;
      x = (secp256k1_modinv64_signed62 *)&local_c8;
      iVar5 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)&local_c8,iVar10,&unaff_RBX->modulus,1);
      if (-1 < iVar5) goto LAB_00151c18;
      uVar22 = (int)local_60 + 1;
      local_60 = (ulong)uVar22;
      psVar7 = (secp256k1_modinv64_modinfo *)(ulong)uVar20;
      if (uVar22 == 0xc) {
        return 0;
      }
    } while( true );
  }
  pcStack_d0 = secp256k1_ge_x_on_curve_var;
  secp256k1_jacobi64_maybe_var_cold_17();
  psStack_d8 = unaff_RBX;
  pcStack_d0 = unaff_R14;
  secp256k1_fe_sqr(&sStack_108,(secp256k1_fe *)x);
  secp256k1_fe_mul(&sStack_108,&sStack_108,(secp256k1_fe *)x);
  secp256k1_fe_verify(&sStack_108);
  sStack_108.n[0] = sStack_108.n[0] + 7;
  sStack_108.magnitude = sStack_108.magnitude + 1;
  sStack_108.normalized = 0;
  secp256k1_fe_verify(&sStack_108);
  iVar5 = secp256k1_fe_is_square_var(&sStack_108);
  return iVar5;
}

Assistant:

static int secp256k1_jacobi64_maybe_var(const secp256k1_modinv64_signed62 *x, const secp256k1_modinv64_modinfo *modinfo) {
    /* Start with f=modulus, g=x, eta=-1. */
    secp256k1_modinv64_signed62 f = modinfo->modulus;
    secp256k1_modinv64_signed62 g = *x;
    int j, len = 5;
    int64_t eta = -1; /* eta = -delta; delta is initially 1 */
    int64_t cond, fn, gn;
    int jac = 0;
    int count;

    /* The input limbs must all be non-negative. */
    VERIFY_CHECK(g.v[0] >= 0 && g.v[1] >= 0 && g.v[2] >= 0 && g.v[3] >= 0 && g.v[4] >= 0);

    /* If x > 0, then if the loop below converges, it converges to f=g=gcd(x,modulus). Since we
     * require that gcd(x,modulus)=1 and modulus>=3, x cannot be 0. Thus, we must reach f=1 (or
     * time out). */
    VERIFY_CHECK((g.v[0] | g.v[1] | g.v[2] | g.v[3] | g.v[4]) != 0);

    for (count = 0; count < JACOBI64_ITERATIONS; ++count) {
        /* Compute transition matrix and new eta after 62 posdivsteps. */
        secp256k1_modinv64_trans2x2 t;
        eta = secp256k1_modinv64_posdivsteps_62_var(eta, f.v[0] | ((uint64_t)f.v[1] << 62), g.v[0] | ((uint64_t)g.v[1] << 62), &t, &jac);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */

        secp256k1_modinv64_update_fg_62_var(len, &f, &g, &t);
        /* If the bottom limb of f is 1, there is a chance that f=1. */
        if (f.v[0] == 1) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= f.v[j];
            }
            /* If so, we're done. When f=1, the Jacobi symbol (g | f)=1. */
            if (cond == 0) return 1 - 2*(jac & 1);
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int64_t)len - 2) >> 63;
        cond |= fn;
        cond |= gn;
        /* If so, reduce length. */
        if (cond == 0) --len;

        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */
    }

    /* The loop failed to converge to f=g after 1550 iterations. Return 0, indicating unknown result. */
    return 0;
}